

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

MemberSyntax * __thiscall
slang::parsing::Parser::parseExternMember(Parser *this,SyntaxKind parentKind,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_01;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_02;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_03;
  Token forkJoin_00;
  Token externKeyword;
  Token externKeyword_00;
  SourceRange range;
  SourceRange range_00;
  Token externKeyword_01;
  Token semi_00;
  Token primitive_00;
  Token name_00;
  bool bVar1;
  TokenKind TVar2;
  ModuleHeaderSyntax *pMVar3;
  ExternUdpDeclSyntax *pEVar4;
  ExternModuleDeclSyntax *pEVar5;
  undefined4 in_ESI;
  Info *in_RDI;
  Token TVar6;
  AttrList AVar7;
  SyntaxKind unaff_retaddr;
  Parser *in_stack_00000008;
  bitmask<slang::parsing::detail::FunctionOptions> in_stack_00000014;
  bool *in_stack_00000070;
  Parser *in_stack_00000078;
  Parser *in_stack_000000b8;
  Token semi;
  FunctionPrototypeSyntax *proto;
  Token forkJoin;
  Token keyword_2;
  UdpPortListSyntax *portList;
  Token name;
  Token primitive;
  AttrList actualAttrs_1;
  Token keyword_1;
  bool unused;
  ModuleHeaderSyntax *header;
  AttrList actualAttrs;
  Token keyword;
  uint32_t index;
  ModuleHeaderSyntax *in_stack_fffffffffffffcb8;
  ParserBase *in_stack_fffffffffffffcc0;
  ParserBase *in_stack_fffffffffffffcc8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  SourceLocation in_stack_fffffffffffffce0;
  Info *pIVar8;
  SourceLocation in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  DiagCode in_stack_fffffffffffffcf4;
  undefined6 in_stack_fffffffffffffcf8;
  undefined2 in_stack_fffffffffffffcfe;
  Info *in_stack_fffffffffffffd08;
  SyntaxNode *in_stack_fffffffffffffd10;
  Info *in_stack_fffffffffffffd18;
  TokenKind in_stack_fffffffffffffd4e;
  ParserBase *in_stack_fffffffffffffd50;
  SyntaxFactory *local_280;
  Info *local_278;
  bitmask<slang::parsing::detail::FunctionOptions> local_26c;
  FunctionPrototypeSyntax *local_268;
  Token local_260;
  Token local_250;
  UdpPortListSyntax *local_240;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_238;
  undefined8 local_230;
  Info *local_228;
  pointer local_220;
  size_t local_218;
  undefined8 local_1d8;
  Info *local_1d0;
  SourceRange local_180;
  undefined4 local_16c;
  UdpPortListSyntax *local_168;
  Token local_160;
  Token local_150;
  AttrList local_140;
  Token local_130;
  pointer local_118;
  Parser *in_stack_fffffffffffffef0;
  pointer local_58;
  bool *in_stack_fffffffffffffff8;
  
  bVar1 = scanAttributes((Parser *)CONCAT26(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8),
                         (uint32_t *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  if (!bVar1) {
    return (MemberSyntax *)0x0;
  }
  TVar6 = ParserBase::peek(in_stack_fffffffffffffcc8,
                           (uint32_t)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
  TVar2 = TVar6.kind;
  if ((ushort)(TVar2 - ForkJoinKeyword) < 2) {
LAB_005e0c53:
    local_250 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffce0);
    local_260 = ParserBase::consumeIf
                          (in_stack_fffffffffffffcc0,
                           (TokenKind)((ulong)in_stack_fffffffffffffcb8 >> 0x30));
    bitmask<slang::parsing::detail::FunctionOptions>::bitmask(&local_26c,IsPrototype);
    local_268 = parseFunctionPrototype
                          (in_stack_00000008,unaff_retaddr,in_stack_00000014,
                           in_stack_fffffffffffffff8);
    TVar6 = ParserBase::expect(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4e);
    pIVar8 = in_RDI + 0xe;
    elements_03._M_extent._M_extent_value = in_stack_fffffffffffffcd0._M_extent_value;
    elements_03._M_ptr = (pointer)in_stack_fffffffffffffcc8;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffcc0,
               elements_03);
    local_280 = TVar6._0_8_;
    local_278 = TVar6.info;
    externKeyword_00.rawLen = in_ESI;
    externKeyword_00.kind = (short)in_stack_fffffffffffffcd8;
    externKeyword_00._2_1_ = (char)((uint)in_stack_fffffffffffffcd8 >> 0x10);
    externKeyword_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffcd8 >> 0x18);
    externKeyword_00.info = pIVar8;
    forkJoin_00.info = (Info *)in_stack_fffffffffffffcd0._M_extent_value;
    forkJoin_00._0_8_ = local_278;
    semi_00.rawLen._2_2_ = TVar2;
    semi_00._0_6_ = in_stack_fffffffffffffcf8;
    semi_00.info = in_RDI;
    pEVar5 = (ExternModuleDeclSyntax *)
             slang::syntax::SyntaxFactory::externInterfaceMethod
                       (local_280,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_268,
                        externKeyword_00,forkJoin_00,
                        (FunctionPrototypeSyntax *)
                        CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),semi_00);
  }
  else {
    if (((TVar2 != InterfaceKeyword) && (TVar2 != MacromoduleKeyword)) && (TVar2 != ModuleKeyword))
    {
      if (TVar2 == PrimitiveKeyword) {
        local_130 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffce0);
        local_140 = parseAttributes(in_stack_fffffffffffffef0);
        local_150 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffce0);
        local_160 = ParserBase::expect(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4e);
        local_168 = parseUdpPortList(in_stack_00000078,in_stack_00000070);
        if ((local_168->super_SyntaxNode).kind == WildcardUdpPortList) {
          local_16c = 0x5a0005;
          local_180 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffd10);
          range_00.endLoc = in_stack_fffffffffffffce8;
          range_00.startLoc = in_stack_fffffffffffffce0;
          ParserBase::addDiag((ParserBase *)
                              CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                              in_stack_fffffffffffffcf4,range_00);
        }
        pIVar8 = in_RDI + 0xe;
        elements_01._M_extent._M_extent_value = in_stack_fffffffffffffcd0._M_extent_value;
        elements_01._M_ptr = (pointer)in_stack_fffffffffffffcc8;
        slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                  ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffcc0,
                   elements_01);
        TVar6 = local_130;
        local_1d8._0_2_ = local_130.kind;
        local_1d8._2_1_ = local_130._2_1_;
        local_1d8._3_1_ = local_130.numFlags.raw;
        local_1d8._4_4_ = local_130.rawLen;
        local_130.info = TVar6.info;
        local_1d0 = local_130.info;
        local_220 = local_140._M_ptr;
        local_218 = local_140._M_extent._M_extent_value;
        elements_02._M_extent._M_extent_value = in_stack_fffffffffffffcd0._M_extent_value;
        elements_02._M_ptr = (pointer)in_stack_fffffffffffffcc8;
        local_130 = TVar6;
        slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                  ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffcc0,
                   elements_02);
        TVar6 = local_150;
        local_230._0_2_ = local_150.kind;
        local_230._2_1_ = local_150._2_1_;
        local_230._3_1_ = local_150.numFlags.raw;
        local_230._4_4_ = local_150.rawLen;
        local_150.info = TVar6.info;
        local_228 = local_150.info;
        local_240 = (UdpPortListSyntax *)local_160._0_8_;
        local_238 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_160.info;
        externKeyword_01.info._0_4_ = in_stack_fffffffffffffcf0;
        externKeyword_01._0_8_ = pIVar8;
        externKeyword_01.info._4_4_ = in_stack_fffffffffffffcf4;
        primitive_00.info = in_stack_fffffffffffffd08;
        primitive_00._0_8_ = in_RDI;
        name_00.info = in_stack_fffffffffffffd18;
        name_00._0_8_ = in_stack_fffffffffffffd10;
        local_150 = TVar6;
        pEVar4 = slang::syntax::SyntaxFactory::externUdpDecl
                           ((SyntaxFactory *)in_stack_fffffffffffffce0,
                            (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                            CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                            externKeyword_01,
                            (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_160.info,
                            primitive_00,name_00,(UdpPortListSyntax *)local_160._0_8_);
        return &pEVar4->super_MemberSyntax;
      }
      if (TVar2 != ProgramKeyword) {
        if (TVar2 != TaskKeyword) {
          return (MemberSyntax *)0x0;
        }
        goto LAB_005e0c53;
      }
    }
    ParserBase::consume((ParserBase *)in_stack_fffffffffffffce0);
    AVar7 = parseAttributes(in_stack_fffffffffffffef0);
    pMVar3 = parseModuleHeader(in_stack_000000b8);
    if ((pMVar3->ports != (PortListSyntax *)0x0) &&
       ((pMVar3->ports->super_SyntaxNode).kind == WildcardPortList)) {
      slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffd10);
      range.endLoc = in_stack_fffffffffffffce8;
      range.startLoc = in_stack_fffffffffffffce0;
      ParserBase::addDiag((ParserBase *)
                          CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                          in_stack_fffffffffffffcf4,range);
    }
    elements._M_extent._M_extent_value = in_stack_fffffffffffffcd0._M_extent_value;
    elements._M_ptr = (pointer)in_stack_fffffffffffffcc8;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffcc0,
               elements);
    local_58 = AVar7._M_ptr;
    local_118 = local_58;
    elements_00._M_extent._M_extent_value = in_stack_fffffffffffffcd0._M_extent_value;
    elements_00._M_ptr = (pointer)in_stack_fffffffffffffcc8;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffcc0,
               elements_00);
    externKeyword.rawLen = in_stack_fffffffffffffcdc;
    externKeyword.kind = (short)in_stack_fffffffffffffcd8;
    externKeyword._2_1_ = (char)((uint)in_stack_fffffffffffffcd8 >> 0x10);
    externKeyword.numFlags.raw = (char)((uint)in_stack_fffffffffffffcd8 >> 0x18);
    externKeyword.info = (Info *)in_stack_fffffffffffffce0;
    pEVar5 = slang::syntax::SyntaxFactory::externModuleDecl
                       ((SyntaxFactory *)in_stack_fffffffffffffcd0._M_extent_value,
                        (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                        in_stack_fffffffffffffcc8,externKeyword,
                        (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                        in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  }
  return &pEVar5->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseExternMember(SyntaxKind parentKind, AttrList attributes) {
    uint32_t index = 1;
    if (!scanAttributes(index))
        return nullptr;

    switch (peek(index).kind) {
        case TokenKind::ModuleKeyword:
        case TokenKind::MacromoduleKeyword:
        case TokenKind::InterfaceKeyword:
        case TokenKind::ProgramKeyword: {
            auto keyword = consume();
            auto actualAttrs = parseAttributes();
            auto& header = parseModuleHeader();
            if (header.ports && header.ports->kind == SyntaxKind::WildcardPortList)
                addDiag(diag::ExternWildcardPortList, header.ports->sourceRange());
            return &factory.externModuleDecl(attributes, keyword, actualAttrs, header);
        }
        case TokenKind::PrimitiveKeyword: {
            bool unused;
            auto keyword = consume();
            auto actualAttrs = parseAttributes();
            auto primitive = consume();
            auto name = expect(TokenKind::Identifier);
            auto& portList = parseUdpPortList(unused);
            if (portList.kind == SyntaxKind::WildcardUdpPortList)
                addDiag(diag::ExternWildcardPortList, portList.sourceRange());
            return &factory.externUdpDecl(attributes, keyword, actualAttrs, primitive, name,
                                          portList);
        }
        case TokenKind::ForkJoinKeyword:
        case TokenKind::FunctionKeyword:
        case TokenKind::TaskKeyword: {
            // If there were more attributes here it's invalid,
            // we'll come back around later after tokens are skipped.
            if (index != 1)
                return nullptr;

            auto keyword = consume();
            auto forkJoin = consumeIf(TokenKind::ForkJoinKeyword);
            auto& proto = parseFunctionPrototype(parentKind, FunctionOptions::IsPrototype);
            auto semi = expect(TokenKind::Semicolon);
            return &factory.externInterfaceMethod(attributes, keyword, forkJoin, proto, semi);
        }
        default:
            return nullptr;
    }
}